

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyOfferPdu.cpp
# Opt level: O0

void __thiscall DIS::ResupplyOfferPdu::ResupplyOfferPdu(ResupplyOfferPdu *this)

{
  ResupplyOfferPdu *this_local;
  
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__ResupplyOfferPdu_00268d00;
  EntityID::EntityID(&this->_receivingEntityID);
  EntityID::EntityID(&this->_supplyingEntityID);
  this->_numberOfSupplyTypes = '\0';
  this->_padding1 = '\0';
  this->_padding2 = 0;
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::vector(&this->_supplies);
  PduSuperclass::setPduType((PduSuperclass *)this,'\x06');
  return;
}

Assistant:

ResupplyOfferPdu::ResupplyOfferPdu() : LogisticsFamilyPdu(),
   _receivingEntityID(), 
   _supplyingEntityID(), 
   _numberOfSupplyTypes(0), 
   _padding1(0), 
   _padding2(0)
{
    setPduType( 6 );
}